

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void stbds_hmfree_func(void *a,size_t elemsize)

{
  undefined8 local_20;
  size_t i;
  size_t elemsize_local;
  void *a_local;
  
  if (a != (void *)0x0) {
    if (*(long *)((long)a + -0x10) != 0) {
      if (*(char *)(*(long *)((long)a + -0x10) + 0x59) == '\x02') {
        for (local_20 = 1; local_20 < *(ulong *)((long)a + -0x20); local_20 = local_20 + 1) {
          free(*(void **)((long)a + elemsize * local_20));
        }
      }
      stbds_strreset((stbds_string_arena *)(*(long *)((long)a + -0x10) + 0x48));
    }
    free(*(void **)((long)a + -0x10));
    free((void *)((long)a + -0x20));
  }
  return;
}

Assistant:

void stbds_hmfree_func(void *a, size_t elemsize)
{
  if (a == NULL) return;
  if (stbds_hash_table(a) != NULL) {
    if (stbds_hash_table(a)->string.mode == STBDS_SH_STRDUP) {
      size_t i;
      // skip 0th element, which is default
      for (i=1; i < stbds_header(a)->length; ++i)
        STBDS_FREE(NULL, *(char**) ((char *) a + elemsize*i));
    }
    stbds_strreset(&stbds_hash_table(a)->string);
  }
  STBDS_FREE(NULL, stbds_header(a)->hash_table);
  STBDS_FREE(NULL, stbds_header(a));
}